

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O3

void Test23(void)

{
  CMReturn In;
  CMReturn In_00;
  string in;
  CMReturn res;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  ConfusableMatcher matcher;
  long *local_21b8;
  long local_21b0;
  long local_21a8 [2];
  CMReturn local_2198;
  undefined4 local_2180;
  undefined4 uStack_217c;
  long lStack_2178;
  undefined4 local_2170;
  undefined4 uStack_216c;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  _Alloc_hider local_2150;
  size_t in_stack_ffffffffffffdeb8;
  undefined8 in_stack_ffffffffffffdec0;
  string local_2130;
  _Alloc_hider local_2110;
  undefined8 in_stack_ffffffffffffdf00;
  undefined8 in_stack_ffffffffffffdf08;
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20e0;
  undefined1 local_20d0;
  undefined7 uStack_20cf;
  undefined1 uStack_20c8;
  undefined7 uStack_20c7;
  undefined1 uStack_20c0;
  undefined7 uStack_20bf;
  undefined8 uStack_20b8;
  undefined8 local_20b0;
  undefined8 uStack_20a8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20a0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2088;
  CMReturn local_2070;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2058;
  ConfusableMatcher local_2020;
  
  GetDefaultMap_abi_cxx11_();
  local_21b8 = local_21a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_21b8,"AA BB CC AA FF AA RR","");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_20a0,&local_2088);
  local_2058._M_buckets = &local_2058._M_single_bucket;
  local_2058._M_bucket_count = 1;
  local_2058._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2058._M_element_count = 0;
  local_2058._M_rehash_policy._M_max_load_factor = 1.0;
  local_2058._M_rehash_policy._4_4_ = 0;
  local_2058._M_rehash_policy._M_next_resize = 0;
  local_2058._M_single_bucket = (__node_base_ptr)0x0;
  ConfusableMatcher::ConfusableMatcher
            (&local_2020,&local_20a0,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2058,true);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2058);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_20a0);
  _Var1._M_p = (pointer)&local_20e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffdf10,local_21b8,local_21b0 + (long)local_21b8);
  local_2110._M_p = &stack0xffffffffffffdf00;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2110,"AA","");
  local_20d0 = 1;
  uStack_20cf = 0;
  uStack_20c8 = 0;
  uStack_20c7 = 0;
  uStack_20c0 = 0;
  uStack_20bf = 0;
  uStack_20b8 = 1000000;
  local_20b0 = 0;
  uStack_20a8 = 0;
  ConfusableMatcher::IndexOf
            (&local_2198,&local_2020,(string *)&stack0xffffffffffffdf10,(string *)&local_2110,
             (CMOptions)ZEXT3248(CONCAT824(1000000,CONCAT816(0,ZEXT816(1)))));
  if (local_2110._M_p != &stack0xffffffffffffdf00) {
    operator_delete(local_2110._M_p,in_stack_ffffffffffffdf00 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != &local_20e0) {
    operator_delete(_Var1._M_p,local_20e0._M_allocated_capacity + 1);
  }
  In.Size = in_stack_ffffffffffffdf08;
  In.Start = in_stack_ffffffffffffdf00;
  In._16_8_ = _Var1._M_p;
  AssertMatch(In,in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
  local_2130._M_dataplus._M_p = (pointer)&local_2130.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2130,local_21b8,(long)local_21b8 + local_21b0);
  local_2150._M_p = &stack0xffffffffffffdec0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2150,"AA","");
  lStack_2178 = local_21b0 + -1;
  local_2180 = 1;
  uStack_217c = 0;
  local_2170 = 1;
  uStack_216c = 0;
  uStack_2168 = 1000000;
  local_2160 = 0;
  uStack_2158 = 0;
  ConfusableMatcher::IndexOf
            (&local_2070,&local_2020,&local_2130,(string *)&local_2150,
             (CMOptions)
             ZEXT3248(CONCAT824(1000000,CONCAT420(0,CONCAT416(1,CONCAT88(lStack_2178,1))))));
  local_2198.Status = local_2070.Status;
  local_2198._20_4_ = local_2070._20_4_;
  local_2198.Start = local_2070.Start;
  local_2198.Size = local_2070.Size;
  if (local_2150._M_p != &stack0xffffffffffffdec0) {
    operator_delete(local_2150._M_p,in_stack_ffffffffffffdec0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2130._M_dataplus._M_p != &local_2130.field_2) {
    operator_delete(local_2130._M_dataplus._M_p,local_2130.field_2._M_allocated_capacity + 1);
  }
  In_00.Size = in_stack_ffffffffffffdf08;
  In_00.Start = in_stack_ffffffffffffdf00;
  In_00._16_8_ = _Var1._M_p;
  AssertMatch(In_00,in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
  ConfusableMatcher::~ConfusableMatcher(&local_2020);
  if (local_21b8 != local_21a8) {
    operator_delete(local_21b8,local_21a8[0] + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2088);
  return;
}

Assistant:

void Test23()
{
	auto map = GetDefaultMap();

	std::string in = "AA BB CC AA FF AA RR";

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchRepeating = true;
	auto matcher = ConfusableMatcher(map, {});
	auto res = matcher.IndexOf(in, "AA", opts);
	AssertMatch(res, 0, 2);

	opts.StartIndex = in.size() - 1;
	opts.StartFromEnd = true;
	res = matcher.IndexOf(in, "AA", opts);
	AssertMatch(res, 15, 2);
}